

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

QSpacerItem *
QLayoutPrivate::createSpacerItem(QLayout *layout,int w,int h,Policy hPolicy,Policy vPolicy)

{
  QSpacerItem *pQVar1;
  
  if ((spacerItemFactoryMethod != (QSpacerItemFactoryMethod)0x0) &&
     (pQVar1 = (*spacerItemFactoryMethod)(layout,w,h,hPolicy,vPolicy), pQVar1 != (QSpacerItem *)0x0)
     ) {
    return pQVar1;
  }
  pQVar1 = (QSpacerItem *)operator_new(0x28);
  (pQVar1->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  (pQVar1->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QSpacerItem_007f4e48;
  *(int *)&(pQVar1->super_QLayoutItem).field_0xc = w;
  pQVar1->height = h;
  (pQVar1->sizeP).field_0.data = (vPolicy & 0xf) << 0x14 | (hPolicy & 0xf) << 0x10;
  (pQVar1->rect).x1 = 0;
  (pQVar1->rect).y1 = 0;
  (pQVar1->rect).x2 = -1;
  (pQVar1->rect).y2 = -1;
  return pQVar1;
}

Assistant:

QSpacerItem *QLayoutPrivate::createSpacerItem(const QLayout *layout, int w, int h, QSizePolicy::Policy hPolicy, QSizePolicy::Policy vPolicy)
{
    if (spacerItemFactoryMethod)
        if (QSpacerItem *si = (*spacerItemFactoryMethod)(layout, w, h, hPolicy, vPolicy))
            return si;
    return new QSpacerItem(w, h,  hPolicy, vPolicy);
}